

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
I2sSimulationDataGenerator::Initialize
          (I2sSimulationDataGenerator *this,U32 simulation_sample_rate,I2sAnalyzerSettings *settings
          )

{
  uint uVar1;
  PcmFrameType PVar2;
  SimulationChannelDescriptor *pSVar3;
  S64 SVar4;
  value_type local_ac;
  uint local_a8;
  value_type local_a4;
  U32 i_10;
  uint local_9c;
  value_type local_98;
  U32 i_9;
  value_type local_90;
  U32 i_8;
  value_type local_88;
  U32 i_7;
  uint local_80;
  value_type local_7c;
  U32 i_6;
  value_type local_74;
  U32 i_5;
  value_type local_6c;
  U32 i_4;
  uint local_64;
  value_type local_60;
  U32 i_3;
  uint local_58;
  U32 i_2;
  U32 low_count;
  U32 high_count;
  U32 bits_per_word;
  U32 i_1;
  U64 mask_1;
  ulong uStack_38;
  U32 i;
  U64 mask;
  U64 audio_bit_depth;
  double bits_per_s;
  I2sAnalyzerSettings *settings_local;
  I2sSimulationDataGenerator *pIStack_10;
  U32 simulation_sample_rate_local;
  I2sSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  bits_per_s = (double)settings;
  settings_local._4_4_ = simulation_sample_rate;
  pIStack_10 = this;
  if (this->mSettings->mDataValidEdge == NegEdge) {
    pSVar3 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationChannels,(int)this->mSettings + 0x10,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar3;
  }
  else {
    pSVar3 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationChannels,(int)this->mSettings + 0x10,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar3;
  }
  pSVar3 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mSimulationChannels,(int)this->mSettings + 0x20,
                      this->mSimulationSampleRateHz);
  this->mFrame = pSVar3;
  pSVar3 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mSimulationChannels,(int)this->mSettings + 0x30,
                      this->mSimulationSampleRateHz);
  this->mData = pSVar3;
  InitSineWave(this);
  audio_bit_depth =
       (U64)((this->mAudioSampleRate + this->mAudioSampleRate) *
            (double)(this->mSettings->mBitsPerWord + this->mNumPaddingBits));
  ClockGenerator::Init((double)audio_bit_depth,(int)this + 0x60);
  this->mCurrentAudioWordIndex = 0;
  this->mCurrentAudioChannel = Left;
  this->mPaddingCount = 0;
  uVar1 = this->mSettings->mBitsPerWord;
  mask = (U64)uVar1;
  if (this->mSettings->mShiftOrder == MsbFirst) {
    uStack_38 = 1L << ((char)uVar1 - 1U & 0x3f);
    for (mask_1._4_4_ = 0; mask_1._4_4_ < mask; mask_1._4_4_ = mask_1._4_4_ + 1) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mBitMasks,&stack0xffffffffffffffc8);
      uStack_38 = uStack_38 >> 1;
    }
  }
  else {
    _bits_per_word = 1;
    for (high_count = 0; high_count < mask; high_count = high_count + 1) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mBitMasks,(value_type *)&bits_per_word);
      _bits_per_word = _bits_per_word << 1;
    }
  }
  low_count = (int)mask + this->mNumPaddingBits;
  PVar2 = this->mSettings->mFrameType;
  if (PVar2 == FRAME_TRANSITION_TWICE_EVERY_WORD) {
    if ((this->mUseShortFrames & 1U) == 0) {
      i_2 = low_count >> 1;
      local_58 = low_count - i_2;
      for (i_3 = 0; i_3 < i_2; i_3 = i_3 + 1) {
        local_60 = BIT_HIGH;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_60);
      }
      for (local_64 = 0; local_64 < local_58; local_64 = local_64 + 1) {
        i_4 = 0;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&i_4);
      }
    }
    else {
      local_6c = BIT_HIGH;
      std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_6c);
      for (i_5 = 1; i_5 < low_count; i_5 = i_5 + 1) {
        local_74 = BIT_LOW;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_74);
      }
    }
  }
  else if (PVar2 == FRAME_TRANSITION_ONCE_EVERY_WORD) {
    if ((this->mUseShortFrames & 1U) == 0) {
      for (i_6 = 0; i_6 < low_count; i_6 = i_6 + 1) {
        local_7c = BIT_HIGH;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_7c);
      }
      for (local_80 = 0; local_80 < low_count; local_80 = local_80 + 1) {
        i_7 = 0;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&i_7);
      }
    }
    else {
      local_88 = BIT_HIGH;
      std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_88);
      for (i_8 = 1; i_8 < low_count << 1; i_8 = i_8 + 1) {
        local_90 = BIT_LOW;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_90);
      }
    }
  }
  else if (PVar2 == FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS) {
    if ((this->mUseShortFrames & 1U) == 0) {
      for (i_9 = 0; i_9 < low_count << 1; i_9 = i_9 + 1) {
        local_98 = BIT_HIGH;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_98);
      }
      for (local_9c = 0; local_9c < low_count << 1; local_9c = local_9c + 1) {
        i_10 = 0;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&i_10);
      }
    }
    else {
      local_a4 = BIT_HIGH;
      std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_a4);
      for (local_a8 = 1; local_a8 < low_count << 2; local_a8 = local_a8 + 1) {
        local_ac = BIT_LOW;
        std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFrameBits,&local_ac);
      }
    }
  }
  else {
    AnalyzerHelpers::Assert("unexpected");
  }
  SVar4 = GetNextAudioWord(this);
  this->mCurrentWord = SVar4;
  this->mCurrentBitIndex = 0;
  this->mCurrentFrameBitIndex = 0;
  this->mBitGenerationState = Init;
  return;
}

Assistant:

void I2sSimulationDataGenerator::Initialize( U32 simulation_sample_rate, I2sAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    if( mSettings->mDataValidEdge == AnalyzerEnums::NegEdge )
        mClock = mSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
    else
        mClock = mSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );

    mFrame = mSimulationChannels.Add( mSettings->mFrameChannel, mSimulationSampleRateHz, BIT_LOW );
    mData = mSimulationChannels.Add( mSettings->mDataChannel, mSimulationSampleRateHz, BIT_LOW );

    InitSineWave();
    double bits_per_s = mAudioSampleRate * 2.0 * double( mSettings->mBitsPerWord + mNumPaddingBits );
    mClockGenerator.Init( bits_per_s, mSimulationSampleRateHz );

    mCurrentAudioWordIndex = 0;
    mCurrentAudioChannel = Left;
    mPaddingCount = 0;

    U64 audio_bit_depth = mSettings->mBitsPerWord;

    if( mSettings->mShiftOrder == AnalyzerEnums::MsbFirst )
    {
        U64 mask = 1ULL << ( audio_bit_depth - 1 );
        for( U32 i = 0; i < audio_bit_depth; i++ )
        {
            mBitMasks.push_back( mask );
            mask = mask >> 1;
        }
    }
    else
    {
        U64 mask = 1;
        for( U32 i = 0; i < audio_bit_depth; i++ )
        {
            mBitMasks.push_back( mask );
            mask = mask << 1;
        }
    }

    // enum PcmFrameType { FRAME_TRANSITION_TWICE_EVERY_WORD, FRAME_TRANSITION_ONCE_EVERY_WORD, FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS };
    U32 bits_per_word = audio_bit_depth + mNumPaddingBits;
    switch( mSettings->mFrameType )
    {
    case FRAME_TRANSITION_TWICE_EVERY_WORD:
        if( mUseShortFrames == false )
        {
            U32 high_count = bits_per_word / 2;
            U32 low_count = bits_per_word - high_count;
            for( U32 i = 0; i < high_count; i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < low_count; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    case FRAME_TRANSITION_ONCE_EVERY_WORD:
        if( mUseShortFrames == false )
        {
            for( U32 i = 0; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    case FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS:
        if( mUseShortFrames == false )
        {
            for( U32 i = 0; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < ( bits_per_word * 4 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        break;
    }

    mCurrentWord = GetNextAudioWord();
    mCurrentBitIndex = 0;
    mCurrentFrameBitIndex = 0;
    mBitGenerationState = Init;
}